

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

ValueType * __thiscall
huelang::WordValue::getType(ValueType *__return_storage_ptr__,WordValue *this,Environment *env)

{
  long lVar1;
  Word WVar2;
  DefinitionTable table;
  string sStack_18040;
  DefinitionTable DStack_18020;
  
  lVar1 = 0;
  do {
    std::vector<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>::
    vector((vector<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_> *)
           ((long)&DStack_18020.buckets[0].
                   super__Vector_base<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar1),
           (vector<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_> *)
           ((long)&(env->definitionTable).buckets[0].
                   super__Vector_base<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x18000);
  sStack_18040._M_dataplus._M_p = (pointer)&sStack_18040.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_18040,"word","");
  WVar2 = DefinitionTable::TokToWord(&DStack_18020,&sStack_18040);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_18040._M_dataplus._M_p != &sStack_18040.field_2) {
    operator_delete(sStack_18040._M_dataplus._M_p,sStack_18040.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->compound =
       (vector<huelang::ValueType,_std::allocator<huelang::ValueType>_> *)0x0;
  (__return_storage_ptr__->atom).major = WVar2.major;
  (__return_storage_ptr__->atom).minor = WVar2.minor;
  __return_storage_ptr__->isCompound = false;
  lVar1 = 0x17fe8;
  do {
    std::vector<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>::
    ~vector((vector<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_> *
            )((long)&DStack_18020.buckets[0].
                     super__Vector_base<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

ValueType WordValue::getType(Environment& env) {
        DefinitionTable table = env.definitionTable;
        Word wordword = table.TokToWord(WORDWORD);
        return ValueType{NULL, wordword, false};
    }